

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytedata_p.h
# Opt level: O0

ssize_t __thiscall QByteDataBuffer::read(QByteDataBuffer *this,int __fd,void *__buf,size_t __nbytes)

{
  longlong *plVar1;
  char *pcVar2;
  void *__buf_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QByteArray *byteData;
  QByteDataBuffer *this_00;
  qint64 local_18;
  void *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this;
  local_10 = __buf;
  local_18 = byteAmount((QByteDataBuffer *)CONCAT44(in_register_00000034,__fd));
  plVar1 = qMin<long_long>(&local_18,(longlong *)&local_10);
  local_10 = (void *)*plVar1;
  (this->buffers).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (this->buffers).d.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
  (this->buffers).d.size = -0x5555555555555556;
  QByteArray::QByteArray((QByteArray *)0x30824c);
  QByteArray::resize((longlong)this);
  pcVar2 = QByteArray::data((QByteArray *)this_00);
  __buf_00 = (void *)QByteArray::size((QByteArray *)this);
  read((QByteDataBuffer *)CONCAT44(in_register_00000034,__fd),(int)pcVar2,__buf_00,__nbytes);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (ssize_t)this_00;
}

Assistant:

inline QByteArray read(qint64 amount)
    {
        amount = qMin(byteAmount(), amount);
        if constexpr (sizeof(qsizetype) == sizeof(int)) { // 32-bit
            // While we cannot overall have more than INT_MAX memory allocated,
            // the QByteArrays we hold may be shared copies of each other,
            // causing byteAmount() to exceed INT_MAX.
            if (amount > INT_MAX)
                qBadAlloc(); // what resize() would do if it saw past the truncation
        }
        QByteArray byteData;
        byteData.resize(qsizetype(amount));
        read(byteData.data(), byteData.size());
        return byteData;
    }